

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::TimeZoneFormat::parseShortZoneID
          (TimeZoneFormat *this,UnicodeString *text,ParsePosition *pos,UnicodeString *tzID)

{
  TextTrieMap *this_00;
  UnicodeString *this_01;
  ParsePosition *text_00;
  UBool UVar1;
  int32_t start_00;
  ZoneIdMatchHandler *pZVar2;
  UChar *srcChars;
  code *size;
  ZoneIdMatchHandler *local_68;
  LocalPointerBase<icu_63::ZoneIdMatchHandler> local_40;
  LocalPointer<icu_63::ZoneIdMatchHandler> handler;
  int32_t len;
  int32_t start;
  UErrorCode status;
  UnicodeString *tzID_local;
  ParsePosition *pos_local;
  UnicodeString *text_local;
  TimeZoneFormat *this_local;
  
  len = 0;
  size = initShortZoneIdTrie;
  _start = tzID;
  tzID_local = (UnicodeString *)pos;
  pos_local = (ParsePosition *)text;
  text_local = (UnicodeString *)this;
  umtx_initOnce((UInitOnce *)&gShortZoneIdTrieInitOnce,initShortZoneIdTrie,&len);
  start_00 = ParsePosition::getIndex((ParsePosition *)tzID_local);
  handler.super_LocalPointerBase<icu_63::ZoneIdMatchHandler>.ptr._4_4_ = 0;
  UnicodeString::setToBogus(_start);
  UVar1 = ::U_SUCCESS(len);
  if (UVar1 != '\0') {
    pZVar2 = (ZoneIdMatchHandler *)UMemory::operator_new((UMemory *)0x18,(size_t)size);
    local_68 = (ZoneIdMatchHandler *)0x0;
    if (pZVar2 != (ZoneIdMatchHandler *)0x0) {
      ZoneIdMatchHandler::ZoneIdMatchHandler(pZVar2);
      local_68 = pZVar2;
    }
    LocalPointer<icu_63::ZoneIdMatchHandler>::LocalPointer
              ((LocalPointer<icu_63::ZoneIdMatchHandler> *)&local_40,local_68);
    text_00 = pos_local;
    this_00 = gShortZoneIdTrie;
    pZVar2 = LocalPointerBase<icu_63::ZoneIdMatchHandler>::getAlias(&local_40);
    TextTrieMap::search(this_00,(UnicodeString *)text_00,start_00,
                        &pZVar2->super_TextTrieMapSearchResultHandler,&len);
    pZVar2 = LocalPointerBase<icu_63::ZoneIdMatchHandler>::operator->(&local_40);
    handler.super_LocalPointerBase<icu_63::ZoneIdMatchHandler>.ptr._4_4_ =
         ZoneIdMatchHandler::getMatchLen(pZVar2);
    this_01 = _start;
    if (0 < handler.super_LocalPointerBase<icu_63::ZoneIdMatchHandler>.ptr._4_4_) {
      pZVar2 = LocalPointerBase<icu_63::ZoneIdMatchHandler>::operator->(&local_40);
      srcChars = ZoneIdMatchHandler::getID(pZVar2);
      UnicodeString::setTo(this_01,srcChars,-1);
    }
    LocalPointer<icu_63::ZoneIdMatchHandler>::~LocalPointer
              ((LocalPointer<icu_63::ZoneIdMatchHandler> *)&local_40);
  }
  if (handler.super_LocalPointerBase<icu_63::ZoneIdMatchHandler>.ptr._4_4_ < 1) {
    ParsePosition::setErrorIndex((ParsePosition *)tzID_local,start_00);
  }
  else {
    ParsePosition::setIndex
              ((ParsePosition *)tzID_local,
               start_00 + handler.super_LocalPointerBase<icu_63::ZoneIdMatchHandler>.ptr._4_4_);
  }
  return _start;
}

Assistant:

UnicodeString&
TimeZoneFormat::parseShortZoneID(const UnicodeString& text, ParsePosition& pos, UnicodeString& tzID) const {
    UErrorCode status = U_ZERO_ERROR;
    umtx_initOnce(gShortZoneIdTrieInitOnce, &initShortZoneIdTrie, status);

    int32_t start = pos.getIndex();
    int32_t len = 0;
    tzID.setToBogus();

    if (U_SUCCESS(status)) {
        LocalPointer<ZoneIdMatchHandler> handler(new ZoneIdMatchHandler());
        gShortZoneIdTrie->search(text, start, handler.getAlias(), status); 
        len = handler->getMatchLen();
        if (len > 0) {
            tzID.setTo(handler->getID(), -1);
        }
    }

    if (len > 0) {
        pos.setIndex(start + len);
    } else {
        pos.setErrorIndex(start);
    }

    return tzID;
}